

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcDerivedProfileDef::~IfcDerivedProfileDef(IfcDerivedProfileDef *this)

{
  undefined1 *puVar1;
  LazyObject *pLVar2;
  
  *(undefined8 *)&this[-1].super_IfcProfileDef.field_0x60 = 0x8bf990;
  *(undefined8 *)((long)&(this->super_IfcProfileDef).ProfileName.ptr.field_2 + 8) = 0x8bf9e0;
  (this->super_IfcProfileDef).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x8bf9b8;
  puVar1 = *(undefined1 **)
            &(this->super_IfcProfileDef).
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcProfileDef,_2UL>.field_0x20;
  if ((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
      puVar1 != &(this->super_IfcProfileDef).ProfileName) {
    operator_delete(puVar1);
  }
  *(undefined8 *)&this[-1].super_IfcProfileDef.field_0x60 = 0x8bfa08;
  *(undefined8 *)((long)&(this->super_IfcProfileDef).ProfileName.ptr.field_2 + 8) = 0x8bfa30;
  puVar1 = *(undefined1 **)((long)&this[-1].Label.ptr.field_2 + 8);
  if (puVar1 != &this[-1].field_0xa0) {
    operator_delete(puVar1);
  }
  pLVar2 = this[-1].Operator.obj;
  if (pLVar2 != (LazyObject *)&this[-1].Label.ptr._M_string_length) {
    operator_delete(pLVar2);
  }
  operator_delete(&this[-1].super_IfcProfileDef.field_0x60);
  return;
}

Assistant:

IfcDerivedProfileDef() : Object("IfcDerivedProfileDef") {}